

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 jx9CompileBreak(jx9_gen_state *pGen)

{
  SyToken *pSVar1;
  sxi32 sVar2;
  undefined8 in_RAX;
  sxi64 sVar3;
  GenBlock *pBlock;
  sxi32 in_EDX;
  sxi32 extraout_EDX;
  int iBlockType;
  SyToken *pSVar4;
  sxu32 nInstrIdx;
  
  nInstrIdx = (sxu32)((ulong)in_RAX >> 0x20);
  pSVar1 = pGen->pIn;
  pSVar4 = pSVar1 + 1;
  pGen->pIn = pSVar4;
  iBlockType = 0;
  if ((pSVar4 < pGen->pEnd) && ((pSVar1[1].nType & 3) != 0)) {
    sVar3 = jx9TokenValueToInt64(&pSVar4->sData);
    iBlockType = 0;
    if (1 < (int)sVar3) {
      iBlockType = (int)sVar3;
    }
    pSVar4 = pGen->pIn + 1;
    pGen->pIn = pSVar4;
    in_EDX = extraout_EDX;
  }
  pBlock = GenStateFetchBlock(pGen->pCurrent,iBlockType,in_EDX);
  if (pBlock == (GenBlock *)0x0) {
    sVar2 = jx9GenCompileError(pGen,1,pSVar4->nLine,
                               "A \'break\' statement may only be used within a loop or switch");
    if (sVar2 == -10) {
      return -10;
    }
  }
  else {
    sVar2 = jx9VmEmitInstr(pGen->pVm,8,0,0,(void *)0x0,&nInstrIdx);
    if (sVar2 == 0) {
      GenStateNewJumpFixup(pBlock,8,nInstrIdx);
    }
  }
  pSVar4 = pGen->pIn;
  if ((pSVar4 < pGen->pEnd) && ((pSVar4->nType & 0x40000) == 0)) {
    jx9GenCompileError(pGen,2,pSVar4->nLine,"Expected semi-colon \';\' after \'break\' statement");
  }
  return 0;
}

Assistant:

static sxi32 jx9CompileBreak(jx9_gen_state *pGen)
{
	GenBlock *pLoop; /* Target loop */
	sxi32 iLevel;    /* How many nesting loop to skip */
	sxu32 nLine;
	sxi32 rc;
	nLine = pGen->pIn->nLine;
	iLevel = 0;
	/* Jump the 'break' keyword */
	pGen->pIn++;
	if( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & JX9_TK_NUM) ){
		/* optional numeric argument which tells us how many levels
		 * of enclosing loops we should skip to the end of. 
		 */
		iLevel = (sxi32)jx9TokenValueToInt64(&pGen->pIn->sData);
		if( iLevel < 2 ){
			iLevel = 0;
		}
		pGen->pIn++; /* Jump the optional numeric argument */
	}
	/* Extract the target loop */
	pLoop = GenStateFetchBlock(pGen->pCurrent, GEN_BLOCK_LOOP, iLevel);
	if( pLoop == 0 ){
		/* Illegal break */
		rc = jx9GenCompileError(pGen, E_ERROR, pGen->pIn->nLine, "A 'break' statement may only be used within a loop or switch");
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
	}else{
		sxu32 nInstrIdx; 
		rc = jx9VmEmitInstr(pGen->pVm, JX9_OP_JMP, 0, 0, 0, &nInstrIdx);
		if( rc == SXRET_OK ){
			/* Fix the jump later when the jump destination is resolved */
			GenStateNewJumpFixup(pLoop, JX9_OP_JMP, nInstrIdx);
		}
	}
	if( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & JX9_TK_SEMI) == 0 ){
		/* Not so fatal, emit a warning only */
		jx9GenCompileError(&(*pGen), E_WARNING, pGen->pIn->nLine, "Expected semi-colon ';' after 'break' statement");
	}
	/* Statement successfully compiled */
	return SXRET_OK;
}